

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureSamplerCase::iterate(TextureSamplerCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  short sVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  deUint32 err;
  long lVar6;
  pointer puVar7;
  undefined4 extraout_var;
  short sVar8;
  long lVar9;
  char *description;
  int x;
  qpTestResult testResult;
  long lVar10;
  pointer puVar11;
  undefined8 uVar12;
  int iVar13;
  unsigned_short uVar14;
  long lVar15;
  unsigned_short uVar16;
  float posX;
  float fVar17;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface resultImage;
  vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_> gridTexCoords
  ;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  undefined1 local_1a8 [384];
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridVertices,0x1e4,(allocator_type *)local_1a8);
  std::vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::vector
            (&gridTexCoords,0x1e4,(allocator_type *)local_1a8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,0xa56,(allocator_type *)local_1a8);
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  lVar6 = 8;
  lVar9 = 0;
  for (lVar10 = 0; lVar10 != 0x16; lVar10 = lVar10 + 1) {
    fVar17 = (float)(int)lVar10 / 21.0;
    uVar3 = (&Stress::(anonymous_namespace)::s_specialFloats)[lVar10];
    iVar13 = 0;
    for (lVar15 = 0; lVar15 != 0x58; lVar15 = lVar15 + 4) {
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 * 4 + lVar6 + -8
                ) = fVar17 + fVar17 + -1.0;
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 * 4 + lVar6 + -4
                ) = (float)iVar13 / 21.0 + (float)iVar13 / 21.0 + -1.0;
      *(undefined8 *)
       ((long)(gridVertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 * 4 + lVar6) =
           0x3f80000000000000;
      *(ulong *)((long)(gridTexCoords.
                        super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 * 2 + lVar9) =
           CONCAT44(*(undefined4 *)((long)&Stress::(anonymous_namespace)::s_specialFloats + lVar15),
                    uVar3);
      iVar13 = iVar13 + 1;
    }
    lVar6 = lVar6 + 0x160;
    lVar9 = lVar9 + 0xb0;
  }
  puVar7 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 5;
  sVar8 = 0;
  for (lVar6 = 0; puVar11 = puVar7, lVar9 = -0x15, lVar6 != 0x15; lVar6 = lVar6 + 1) {
    for (; lVar9 != 0; lVar9 = lVar9 + 1) {
      sVar1 = (short)lVar9;
      uVar14 = sVar8 + sVar1 + 0x15;
      puVar11[-5] = uVar14;
      uVar16 = sVar8 + 0x2c + sVar1;
      puVar11[-4] = uVar16;
      puVar11[-3] = sVar8 + 0x2b + sVar1;
      puVar11[-2] = uVar14;
      puVar11[-1] = uVar16;
      *puVar11 = sVar8 + sVar1 + 0x16;
      puVar11 = puVar11 + 6;
    }
    puVar7 = puVar7 + 0x7e;
    sVar8 = sVar8 + 0x16;
  }
  local_1a8._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Drawing a textured grid with the shader. Sampling from the texture using special floating point values."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar13 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
             [3])();
  lVar6 = CONCAT44(extraout_var,iVar13);
  uVar3 = (**(code **)(lVar6 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar4 = (**(code **)(lVar6 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  uVar5 = (**(code **)(lVar6 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_sampler");
  (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar6 + 0x188))(0x4000);
  (**(code **)(lVar6 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar6 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar6 + 0x14f0))(uVar5,0);
  uVar12 = 0xde1;
  if (this->m_testType == TEST_TEX_COORD_CUBE) {
    uVar12 = 0x8513;
  }
  (**(code **)(lVar6 + 0xb8))(uVar12,this->m_textureID);
  (**(code **)(lVar6 + 0x19f0))
            (uVar3,4,0x1406,0,0,
             gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar6 + 0x19f0))
            (uVar4,2,0x1406,0,0,
             gridTexCoords.
             super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar6 + 0x610))(uVar3);
  (**(code **)(lVar6 + 0x610))(uVar4);
  (**(code **)(lVar6 + 0x568))
            (4,(ulong)((long)indices.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 1,0x1403);
  (**(code **)(lVar6 + 0x518))(uVar3);
  (**(code **)(lVar6 + 0x518))(uVar4);
  (**(code **)(lVar6 + 0x1680))(0);
  (**(code **)(lVar6 + 0x648))();
  err = (**(code **)(lVar6 + 0x800))();
  glu::checkError(err,"TextureSamplerCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x60a);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1a8,&resultImage);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a8);
  bVar2 = RenderCase::checkResultImage(&this->super_RenderCase,&resultImage);
  if (bVar2) {
    bVar2 = RenderCase::drawTestPattern(&this->super_RenderCase,true);
    testResult = (qpTestResult)!bVar2;
    description = "test pattern failed";
    if (bVar2) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&resultImage);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::
  ~_Vector_base(&gridTexCoords.
                 super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
               );
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridVertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return STOP;
}

Assistant:

TextureSamplerCase::IterateResult TextureSamplerCase::iterate (void)
{
	// Draw a grid and texture it with a texture and sample it using special special values. The result samples should all have the green channel at 255 as per the test image.

	std::vector<tcu::Vec4>	gridVertices	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<tcu::UVec2>	gridTexCoords	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<deUint16>	indices			((DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const float posX = (float)x / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) - 1] to [-1, 1]
		const float posY = (float)y / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f;

		gridVertices[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridTexCoords[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::UVec2(s_specialFloats[x], s_specialFloats[y]);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a textured grid with the shader. Sampling from the texture using special floating point values." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				texCoordLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");
		const GLint				samplerLoc	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.uniform1i(samplerLoc, 0);
		if (m_testType != TEST_TEX_COORD_CUBE)
			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
		else
			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.vertexAttribPointer(texCoordLoc, 2, GL_FLOAT, GL_FALSE, 0, &gridTexCoords[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.enableVertexAttribArray(texCoordLoc);
		gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
		gl.disableVertexAttribArray(positionLoc);
		gl.disableVertexAttribArray(texCoordLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn and samples were from the texture (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing and textures still works
	if (!drawTestPattern(true))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}